

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  TestInfoImpl *pTVar1;
  _Alloc_hider _Var2;
  EmptyTestEventListener EVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  ostream *poVar7;
  TestPartResult *pTVar8;
  TimeInMillis ms;
  long lVar9;
  char *pcVar10;
  int iVar11;
  int i;
  String message;
  string local_88;
  XmlUnitTestResultPrinter local_68;
  XmlUnitTestResultPrinter local_50;
  
  pTVar1 = test_info->impl_;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase name=\"",0x14);
  EscapeXml(&local_68,(test_info->impl_->name_).c_str_,true);
  EVar3.super_TestEventListener._vptr_TestEventListener =
       local_68.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener;
  if (local_68.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener ==
      (_func_int **)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar5 = strlen((char *)local_68.super_EmptyTestEventListener.super_TestEventListener.
                           _vptr_TestEventListener);
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,(char *)EVar3.super_TestEventListener._vptr_TestEventListener,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" status=\"",10);
  uVar6 = (ulong)test_info->impl_->should_run_;
  pcVar10 = "notrun";
  if (uVar6 != 0) {
    pcVar10 = "run";
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,(uVar6 ^ 1) * 3 + 3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" time=\"",8);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_88,(internal *)(pTVar1->result_).elapsed_time_,ms);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" classname=\"",0xd);
  EscapeXml((XmlUnitTestResultPrinter *)&local_50.output_file_.length_,test_case_name,true);
  sVar4 = local_50.output_file_.length_;
  if ((char *)local_50.output_file_.length_ == (char *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar5 = strlen((char *)local_50.output_file_.length_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)sVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  local_68.output_file_.length_ = (size_t)&pTVar1->result_;
  TestPropertiesAsXmlAttributes(&local_50,(TestResult *)local_68.output_file_.length_);
  EVar3.super_TestEventListener._vptr_TestEventListener =
       (TestEventListener)(TestEventListener)local_50.super_EmptyTestEventListener;
  if (local_50.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener ==
      (_func_int **)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar5 = strlen((char *)local_50.super_EmptyTestEventListener.super_TestEventListener.
                           _vptr_TestEventListener);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,(char *)EVar3.super_TestEventListener._vptr_TestEventListener,sVar5);
  }
  if (local_50.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
      (_func_int **)0x0) {
    operator_delete__((void *)local_50.super_EmptyTestEventListener.super_TestEventListener.
                              _vptr_TestEventListener);
  }
  if ((char *)local_50.output_file_.length_ != (char *)0x0) {
    operator_delete__((void *)local_50.output_file_.length_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_68.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener !=
      (_func_int **)0x0) {
    operator_delete__((void *)local_68.super_EmptyTestEventListener.super_TestEventListener.
                              _vptr_TestEventListener);
  }
  if (0 < (int)((ulong)((long)(pTVar1->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar1->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    i = 0;
    iVar11 = 0;
    do {
      pTVar8 = TestResult::GetTestPartResult((TestResult *)local_68.output_file_.length_,i);
      if (pTVar8->type_ != kSuccess) {
        if (iVar11 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"      <failure message=\"",0x18);
        EscapeXml((XmlUnitTestResultPrinter *)&local_88,(pTVar8->summary_).c_str_,true);
        _Var2._M_p = local_88._M_dataplus._M_p;
        if (local_88._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
        }
        else {
          sVar5 = strlen(local_88._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(stream,_Var2._M_p,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>(stream,"\" type=\"\">",10);
        if (local_88._M_dataplus._M_p != (char *)0x0) {
          operator_delete__(local_88._M_dataplus._M_p);
        }
        String::Format((char *)&local_68,"%s:%d\n%s",(pTVar8->file_name_).c_str_,
                       (ulong)(uint)pTVar8->line_number_,(pTVar8->message_).c_str_);
        EVar3.super_TestEventListener._vptr_TestEventListener =
             local_68.super_EmptyTestEventListener.super_TestEventListener._vptr_TestEventListener;
        RemoveInvalidXmlCharacters
                  ((XmlUnitTestResultPrinter *)&local_88,
                   (char *)local_68.super_EmptyTestEventListener.super_TestEventListener.
                           _vptr_TestEventListener);
        if (EVar3.super_TestEventListener._vptr_TestEventListener != (_func_int **)0x0) {
          operator_delete__((void *)EVar3.super_TestEventListener._vptr_TestEventListener);
        }
        _Var2._M_p = local_88._M_dataplus._M_p;
        OutputXmlCDataSection(stream,local_88._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(stream,"</failure>\n",0xb);
        if (_Var2._M_p != (char *)0x0) {
          operator_delete__(_Var2._M_p);
        }
        iVar11 = iVar11 + 1;
      }
      i = i + 1;
    } while (i < (int)((ulong)((long)(pTVar1->result_).test_part_results_.
                                     super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar1->result_).test_part_results_.
                                    super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 6));
    if (iVar11 != 0) {
      pcVar10 = "    </testcase>\n";
      lVar9 = 0x10;
      goto LAB_0014e551;
    }
  }
  pcVar10 = " />\n";
  lVar9 = 4;
LAB_0014e551:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar10,lVar9);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str()
          << "\" status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1)
        *stream << ">\n";
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(part.summary()).c_str()
              << "\" type=\"\">";
      const String message = RemoveInvalidXmlCharacters(String::Format(
          "%s:%d\n%s",
          part.file_name(), part.line_number(),
          part.message()).c_str());
      OutputXmlCDataSection(stream, message.c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}